

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerProfiledStFld
          (Lowerer *this,JitProfilingInstr *stFldInstr,PropertyOperationFlags flags)

{
  OpCode OVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  RegOpnd *opndArg;
  Opnd *pOVar6;
  SymOpnd *pSVar7;
  PropertySymOpnd *pPVar8;
  IntConstOpnd *opndArg_00;
  HelperCallOpnd *newSrc;
  JnHelperMethod local_8c;
  JnHelperMethod local_34;
  JnHelperMethod helper;
  Opnd *dst;
  Instr *instrPrev;
  PropertyOperationFlags flags_local;
  JitProfilingInstr *stFldInstr_local;
  Lowerer *this_local;
  
  if (stFldInstr->profileId != 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1b4b,"(stFldInstr->profileId == Js::Constants::NoProfileId)",
                       "stFldInstr->profileId == Js::Constants::NoProfileId");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pIVar2 = (stFldInstr->super_Instr).m_prev;
  opndArg = IR::Opnd::CreateFramePointerOpnd(this->m_func);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&stFldInstr->super_Instr,&opndArg->super_Opnd);
  if (((stFldInstr->super_Instr).m_opcode == StSuperFld) ||
     ((stFldInstr->super_Instr).m_opcode == StSuperFldStrict)) {
    pOVar6 = IR::Instr::UnlinkSrc2(&stFldInstr->super_Instr);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,&stFldInstr->super_Instr,pOVar6);
  }
  pOVar6 = IR::Instr::UnlinkSrc1(&stFldInstr->super_Instr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&stFldInstr->super_Instr,pOVar6);
  pOVar6 = IR::Instr::UnlinkDst(&stFldInstr->super_Instr);
  bVar4 = IR::Opnd::IsSymOpnd(pOVar6);
  if (bVar4) {
    pSVar7 = IR::Opnd::AsSymOpnd(pOVar6);
    bVar4 = Sym::IsPropertySym(pSVar7->m_sym);
    if (bVar4) goto LAB_007c0a64;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x1b72,"(dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsPropertySym())",
                     "Expected property sym as dst of field store");
  if (!bVar4) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 0;
LAB_007c0a64:
  pPVar8 = IR::Opnd::AsPropertySymOpnd(pOVar6);
  opndArg_00 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar8->m_inlineCacheIndex,this->m_func);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&stFldInstr->super_Instr,&opndArg_00->super_Opnd)
  ;
  LoadPropertySymAsArgument(this,&stFldInstr->super_Instr,pOVar6);
  OVar1 = (stFldInstr->super_Instr).m_opcode;
  if ((OVar1 == InitFld) || (OVar1 == InitRootFld)) {
    local_34 = HelperProfiledInitFld;
  }
  else if (OVar1 == StSuperFld) {
    local_34 = HelperProfiledStSuperFld;
  }
  else if (OVar1 == StSuperFldStrict) {
    local_34 = HelperProfiledStSuperFld_Strict;
  }
  else {
    if ((flags & PropertyOperation_Root) == PropertyOperation_None) {
      local_8c = HelperProfiledStFld;
      if ((flags & PropertyOperation_StrictMode) != PropertyOperation_None) {
        local_8c = HelperProfiledStFld_Strict;
      }
    }
    else {
      local_8c = HelperProfiledStRootFld;
      if ((flags & PropertyOperation_StrictMode) != PropertyOperation_None) {
        local_8c = HelperProfiledStRootFld_Strict;
      }
    }
    local_34 = local_8c;
  }
  newSrc = IR::HelperCallOpnd::New(local_34,this->m_func);
  IR::Instr::SetSrc1(&stFldInstr->super_Instr,&newSrc->super_Opnd);
  LowererMD::LowerCall(&this->m_lowererMD,&stFldInstr->super_Instr,0);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerProfiledStFld(IR::JitProfilingInstr *stFldInstr, Js::PropertyOperationFlags flags)
{
    Assert(stFldInstr->profileId == Js::Constants::NoProfileId);

    IR::Instr *const instrPrev = stFldInstr->m_prev;

    /*
        void ProfilingHelpers::ProfiledInitFld_Jit(
            const Var instance,
            const PropertyId propertyId,
            const InlineCacheIndex inlineCacheIndex,
            const Var value,
            void *const framePointer)

        void ProfilingHelpers::ProfiledStFld_Jit(
            const Var instance,
            const PropertyId propertyId,
            const InlineCacheIndex inlineCacheIndex,
            const Var value,
            void *const framePointer)

        void ProfilingHelpers::ProfiledStSuperFld_Jit(
            const Var instance,
            const PropertyId propertyId,
            const InlineCacheIndex inlineCacheIndex,
            const Var value,
            void *const framePointer,
            const Var thisInstance)
    {
    */

    m_lowererMD.LoadHelperArgument(stFldInstr, IR::Opnd::CreateFramePointerOpnd(m_func));

    if (stFldInstr->m_opcode == Js::OpCode::StSuperFld || stFldInstr->m_opcode == Js::OpCode::StSuperFldStrict)
    {
        m_lowererMD.LoadHelperArgument(stFldInstr, stFldInstr->UnlinkSrc2());
    }

    m_lowererMD.LoadHelperArgument(stFldInstr, stFldInstr->UnlinkSrc1());

    IR::Opnd *dst = stFldInstr->UnlinkDst();
    AssertMsg(dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsPropertySym(), "Expected property sym as dst of field store");
    m_lowererMD.LoadHelperArgument(
        stFldInstr,
        IR::Opnd::CreateInlineCacheIndexOpnd(dst->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));

    LoadPropertySymAsArgument(stFldInstr, dst);

    IR::JnHelperMethod helper;
    switch (stFldInstr->m_opcode)
    {
    case Js::OpCode::InitFld:
    case Js::OpCode::InitRootFld:
        helper = IR::HelperProfiledInitFld;
        break;

    case Js::OpCode::StSuperFld:
        helper = IR::HelperProfiledStSuperFld;
        break;

    case Js::OpCode::StSuperFldStrict:
        helper = IR::HelperProfiledStSuperFld_Strict;
        break;

    default:
        helper =
            flags & Js::PropertyOperation_Root
                ? flags & Js::PropertyOperation_StrictMode ? IR::HelperProfiledStRootFld_Strict : IR::HelperProfiledStRootFld
                : flags & Js::PropertyOperation_StrictMode ? IR::HelperProfiledStFld_Strict : IR::HelperProfiledStFld;
        break;
    }
    stFldInstr->SetSrc1(IR::HelperCallOpnd::New(helper, m_func));
    m_lowererMD.LowerCall(stFldInstr, 0);

    return instrPrev;
}